

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

__pid_t __thiscall kj::_::NeverDone::wait(NeverDone *this,void *__stat_loc)

{
  undefined1 in_stack_00000008 [24];
  OwnPromiseNode local_1c0;
  undefined1 local_1b8 [8];
  ExceptionOr<kj::_::Void> dummy;
  WaitScope *waitScope_local;
  NeverDone *this_local;
  
  dummy._408_8_ = __stat_loc;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)local_1b8);
  neverDone();
  waitImpl(&local_1c0,(ExceptionOrValue *)local_1b8,(WaitScope *)dummy._408_8_,
           (SourceLocation)in_stack_00000008);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_1c0);
  unreachable();
}

Assistant:

void NeverDone::wait(WaitScope& waitScope, SourceLocation location) const {
  ExceptionOr<Void> dummy;
  waitImpl(neverDone(), dummy, waitScope, location);
  KJ_UNREACHABLE;
}